

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::detail::remove_escaped_characters(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  invalid_argument *piVar4;
  long *plVar5;
  uint uVar6;
  size_type *psVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  uint32_t uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (0 < (long)str->_M_string_length) {
    pcVar10 = (str->_M_dataplus)._M_p;
    pcVar2 = pcVar10 + str->_M_string_length;
    do {
      if (*pcVar10 == '\\') {
        if ((long)pcVar2 - (long)pcVar10 < 2) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::operator+(&local_b0,"invalid escape sequence ",str);
          ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_b0);
          __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                      ::std::invalid_argument::~invalid_argument);
        }
        pcVar2 = pcVar10 + 1;
        lVar3 = ::std::__cxx11::string::find(-0x78,(ulong)(uint)(int)pcVar10[1]);
        if ((lVar3 == -1) && (cVar1 = *pcVar2, cVar1 != '0')) {
          if (cVar1 == 'U') {
            if ((long)((str->_M_dataplus)._M_p + (str->_M_string_length - (long)pcVar10)) < 10) {
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+(&local_b0,"unicode sequence must have 8 hex codes ",str);
              ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_b0);
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            lVar3 = 0;
            uVar6 = 0x10000000;
            uVar11 = 0;
            do {
              cVar1 = pcVar10[lVar3 + 2];
              iVar8 = (int)cVar1;
              if ((byte)(cVar1 - 0x30U) < 10) {
                uVar9 = iVar8 - 0x30;
              }
              else if ((byte)(cVar1 + 0xbfU) < 6) {
                uVar9 = iVar8 - 0x37;
              }
              else {
                if (5 < (byte)(cVar1 + 0x9fU)) goto LAB_00132511;
                uVar9 = iVar8 - 0x57;
              }
              if (0xf < uVar9) {
LAB_00132511:
                piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                ::std::operator+(&local_b0,"unicode sequence must have 8 hex codes ",str);
                ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_b0);
                __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                            ::std::invalid_argument::~invalid_argument);
              }
              uVar11 = uVar11 + uVar9 * uVar6;
              uVar6 = uVar6 >> 4;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 8);
            append_codepoint(__return_storage_ptr__,uVar11);
            pcVar10 = pcVar10 + 9;
          }
          else {
            if (cVar1 != 'u') {
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,"unrecognized escape sequence \\","");
              ::std::operator+(&local_50,&local_70,*pcVar2);
              plVar5 = (long *)::std::__cxx11::string::append((char *)&local_50);
              local_90._M_dataplus._M_p = (pointer)*plVar5;
              psVar7 = (size_type *)(plVar5 + 2);
              if ((size_type *)local_90._M_dataplus._M_p == psVar7) {
                local_90.field_2._M_allocated_capacity = *psVar7;
                local_90.field_2._8_8_ = plVar5[3];
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              }
              else {
                local_90.field_2._M_allocated_capacity = *psVar7;
              }
              local_90._M_string_length = plVar5[1];
              *plVar5 = (long)psVar7;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              ::std::operator+(&local_b0,&local_90,str);
              ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_b0);
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            if ((long)((str->_M_dataplus)._M_p + (str->_M_string_length - (long)pcVar10)) < 6) {
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+(&local_b0,"unicode sequence must have 4 hex codes ",str);
              ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_b0);
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            lVar3 = 0;
            uVar6 = 0x1000;
            uVar11 = 0;
            do {
              cVar1 = pcVar10[lVar3 + 2];
              iVar8 = (int)cVar1;
              if ((byte)(cVar1 - 0x30U) < 10) {
                uVar9 = iVar8 - 0x30;
              }
              else if ((byte)(cVar1 + 0xbfU) < 6) {
                uVar9 = iVar8 - 0x37;
              }
              else {
                if (5 < (byte)(cVar1 + 0x9fU)) goto LAB_001324c3;
                uVar9 = iVar8 - 0x57;
              }
              if (0xf < uVar9) {
LAB_001324c3:
                piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                ::std::operator+(&local_b0,"unicode sequence must have 4 hex codes ",str);
                ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_b0);
                __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                            ::std::invalid_argument::~invalid_argument);
              }
              uVar11 = uVar11 + uVar9 * uVar6;
              uVar6 = uVar6 >> 4;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            append_codepoint(__return_storage_ptr__,uVar11);
            pcVar10 = pcVar10 + 5;
          }
        }
        else {
          ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
          pcVar10 = pcVar2;
        }
      }
      else {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pcVar10 = pcVar10 + 1;
      pcVar2 = (str->_M_dataplus)._M_p + str->_M_string_length;
    } while (pcVar10 < pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string remove_escaped_characters(const std::string &str) {

    std::string out;
    out.reserve(str.size());
    for(auto loc = str.begin(); loc < str.end(); ++loc) {
        if(*loc == '\\') {
            if(str.end() - loc < 2) {
                throw std::invalid_argument("invalid escape sequence " + str);
            }
            auto ecloc = escapedCharsCode.find_first_of(*(loc + 1));
            if(ecloc != std::string::npos) {
                out.push_back(escapedChars[ecloc]);
                ++loc;
            } else if(*(loc + 1) == 'u') {
                // must have 4 hex characters
                if(str.end() - loc < 6) {
                    throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16};
                for(int ii = 2; ii < 6; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 5;
            } else if(*(loc + 1) == 'U') {
                // must have 8 hex characters
                if(str.end() - loc < 10) {
                    throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16 * 16 * 16 * 16 * 16};
                for(int ii = 2; ii < 10; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 9;
            } else if(*(loc + 1) == '0') {
                out.push_back('\0');
                ++loc;
            } else {
                throw std::invalid_argument(std::string("unrecognized escape sequence \\") + *(loc + 1) + " in " + str);
            }
        } else {
            out.push_back(*loc);
        }
    }
    return out;
}